

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  bool bVar1;
  char *label_00;
  ulong uVar2;
  
  uVar2 = 1;
  if (window->Active == false) {
    uVar2 = (ulong)window->WasActive;
  }
  label_00 = "%s \'%s\', %d @ 0x%p";
  bVar1 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar2,window);
  if (bVar1) {
    NodeDrawList(window->DrawList,label_00);
    BulletText("Pos: (%.1f,%.1f)",(double)(window->Pos).x,(double)(window->Pos).y);
    BulletText("Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)",(double)(window->Size).x,
               (double)(window->Size).y,(double)(window->SizeContents).x,
               (double)(window->SizeContents).y);
    BulletText("Scroll: (%.2f,%.2f)",(double)(window->Scroll).x,(double)(window->Scroll).y);
    BulletText("Active: %d, Accessed: %d",(ulong)window->Active,(ulong)window->Accessed);
    if (window->RootWindow != window) {
      NodeWindow(window->RootWindow,"RootWindow");
    }
    if (0 < (window->DC).ChildWindows.Size) {
      NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
    }
    BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
    TreePop();
    return;
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
            {
                if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                    return;
                NodeDrawList(window->DrawList, "DrawList");
                ImGui::BulletText("Pos: (%.1f,%.1f)", window->Pos.x, window->Pos.y);
                ImGui::BulletText("Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
                ImGui::BulletText("Scroll: (%.2f,%.2f)", window->Scroll.x, window->Scroll.y);
                ImGui::BulletText("Active: %d, Accessed: %d", window->Active, window->Accessed);
                if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
                if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
                ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
                ImGui::TreePop();
            }